

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O2

void do_cmd_accept_character(command *cmd)

{
  ushort uVar1;
  uint uVar2;
  player_race *ppVar3;
  equip_slot *peVar4;
  start_item *psVar5;
  player_body *ppVar6;
  player_body *ppVar7;
  undefined6 uVar8;
  player *p;
  player_body *ppVar9;
  _Bool _Var10;
  uint32_t uVar11;
  wchar_t wVar12;
  char *pcVar13;
  equip_slot *peVar14;
  obj_property *poVar15;
  object_kind *kind;
  uint *puVar16;
  object *obj;
  object *poVar17;
  byte bVar18;
  player *ppVar19;
  uint8_t uVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  start_item **ppsVar24;
  long lVar25;
  char acStack_88 [88];
  
  options_init_cheat();
  iVar22 = (uint)player->hitdie * 0x32 + -0x32;
  lVar21 = 1;
  ppVar19 = player;
  lVar25 = lVar21;
  do {
    for (; lVar25 != 0x32; lVar25 = lVar25 + 1) {
      uVar11 = Rand_div((uint)ppVar19->hitdie);
      ppVar19 = player;
      player->player_hp[lVar25] = (short)uVar11 + player->player_hp[lVar25 + -1] + 1;
    }
    lVar25 = lVar21;
  } while (((int)ppVar19->player_hp[0x31] < (iVar22 * 3) / 8 + 0x32) ||
          ((iVar22 * 5) / 8 + 0x32 < (int)ppVar19->player_hp[0x31]));
  ignore_birth_init();
  history_clear(player);
  iVar22 = 1;
  history_add(player,"Began the quest to destroy Morgoth.",L'\x01');
  message_add(" ",0);
  message_add("  ",0);
  message_add("====================",0);
  message_add("  ",0);
  message_add(" ",0);
  ppVar9 = bodies;
  ppVar19 = player;
  ppVar3 = player->race;
  if (ppVar3 == (player_race *)0x0) {
    __assert_fail("p->race",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-birth.c"
                  ,0x176,"void player_embody(struct player *)");
  }
  ppVar6 = bodies[ppVar3->body].next;
  pcVar13 = bodies[ppVar3->body].name;
  ppVar7 = bodies + ppVar3->body;
  uVar8 = *(undefined6 *)&ppVar7->field_0x12;
  peVar14 = *(equip_slot **)(&ppVar7->count + 4);
  (ppVar19->body).count = ppVar7->count;
  *(undefined6 *)&(ppVar19->body).field_0x12 = uVar8;
  (ppVar19->body).slots = peVar14;
  (ppVar19->body).next = ppVar6;
  (ppVar19->body).name = pcVar13;
  my_strcpy(acStack_88,ppVar9[ppVar3->body].name,0x50);
  pcVar13 = string_make(acStack_88);
  (ppVar19->body).name = pcVar13;
  peVar14 = (equip_slot *)mem_zalloc((ulong)(ppVar19->body).count << 5);
  (ppVar19->body).slots = peVar14;
  lVar21 = 0;
  for (uVar23 = 0; p = player, uVar23 < (ppVar19->body).count; uVar23 = uVar23 + 1) {
    peVar4 = bodies[ppVar19->race->body].slots;
    *(undefined2 *)((long)&peVar14->type + lVar21) = *(undefined2 *)((long)&peVar4->type + lVar21);
    my_strcpy(acStack_88,*(char **)((long)&peVar4->name + lVar21),0x50);
    pcVar13 = string_make(acStack_88);
    peVar14 = (ppVar19->body).slots;
    *(char **)((long)&peVar14->name + lVar21) = pcVar13;
    lVar21 = lVar21 + 0x20;
  }
  uVar1 = z_info->start_gold;
  player->au_birth = (uint)uVar1;
  p->au = (uint)uVar1;
  player_spells_init(p);
  if ((player->opts).opt[0x29] == true) {
    player_learn_all_runes(player);
  }
  poVar17 = player->obj_k;
  poVar17->to_a = 1;
  poVar17->to_h = 1;
  poVar17->to_d = 1;
  store_reset();
  chunk_list_max = 0;
  player_learn_innate(player);
  cleanup_parser(&randart_parser);
  deactivate_randart_file();
  run_parser(&artifact_parser);
  if ((player->opts).opt[0x1e] == true) {
    seed_randart = Rand_div(0x10000000);
    do_randart(seed_randart,true);
    deactivate_randart_file();
  }
  seed_flavor = Rand_div(0x10000000);
  flavor_init();
  if ((player->opts).opt[0x2a] == true) {
    flavor_set_all_aware();
  }
  ppVar19 = player;
  player->upkeep->total_weight = L'\0';
  poVar17 = ppVar19->obj_k;
  poVar17->dd = '\x01';
  poVar17->ds = '\x01';
  poVar17->ac = 1;
  for (; iVar22 != 0x27; iVar22 = iVar22 + 1) {
    poVar15 = lookup_obj_property(3,iVar22);
    wVar12 = poVar15->subtype;
    if (wVar12 == L'\x04') {
      flag_on_dbg(ppVar19->obj_k->flags,5,iVar22,"p->obj_k->flags","i");
      wVar12 = poVar15->subtype;
    }
    if (wVar12 == L'\a') {
      flag_on_dbg(ppVar19->obj_k->flags,5,iVar22,"p->obj_k->flags","i");
      wVar12 = poVar15->subtype;
    }
    if (wVar12 == L'\b') {
      flag_on_dbg(ppVar19->obj_k->flags,5,iVar22,"p->obj_k->flags","i");
      wVar12 = poVar15->subtype;
    }
    if (wVar12 == L'\t') {
      flag_on_dbg(ppVar19->obj_k->flags,5,iVar22,"p->obj_k->flags","i");
    }
  }
  ppsVar24 = &ppVar19->class->start_items;
  do {
    psVar5 = *ppsVar24;
    if (psVar5 == (start_item *)0x0) {
      if (ppVar19->au < 0) {
        ppVar19->au = 0;
      }
      wield_all(ppVar19);
      update_player_object_knowledge(ppVar19);
      ppVar19 = player;
      player->is_dead = false;
      character_generated = true;
      ppVar19->upkeep->playing = true;
      cmd_disable_repeat();
      string_free(prev.history);
      prev.history = (char *)0x0;
      string_free(quickstart_prev.history);
      quickstart_prev.history = (char *)0x0;
      event_signal(EVENT_LEAVE_BIRTH);
      return;
    }
    iVar22 = rand_range(psVar5->min,psVar5->max);
    kind = lookup_kind(psVar5->tval,psVar5->sval);
    if (kind == (object_kind *)0x0) {
      __assert_fail("kind",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-birth.c"
                    ,0x261,"void player_outfit(struct player *)");
    }
    uVar20 = (uint8_t)iVar22;
    if ((ppVar19->opts).opt[0x27] == false) {
      _Var10 = tval_is_food_k(kind);
      uVar20 = '\x01';
      if (_Var10) goto LAB_00198358;
      _Var10 = tval_is_light_k(kind);
      if (_Var10) goto LAB_00198358;
    }
    else {
LAB_00198358:
      puVar16 = (uint *)psVar5->eopts;
      if (puVar16 != (uint *)0x0) {
        bVar18 = 1;
        while( true ) {
          uVar2 = *puVar16;
          if (((ulong)uVar2 == 0) || ((bVar18 & 1) == 0)) break;
          if ((int)uVar2 < 1) {
            bVar18 = (ppVar19->opts).opt[-uVar2];
          }
          else {
            bVar18 = (ppVar19->opts).opt[uVar2] ^ 1;
          }
          puVar16 = puVar16 + 1;
        }
        if ((bVar18 & 1) == 0) goto LAB_00198432;
      }
      obj = object_new();
      object_prep(obj,kind,L'\0',MINIMISE);
      obj->number = uVar20;
      obj->origin = '\x12';
      poVar17 = object_new();
      obj->known = poVar17;
      object_set_base_known(ppVar19,obj);
      object_flavor_aware(ppVar19,obj);
      poVar17 = obj->known;
      poVar17->pval = obj->pval;
      poVar17->effect = obj->effect;
      poVar17->notice = poVar17->notice | 2;
      wVar12 = object_value_real(obj,(uint)obj->number);
      ppVar19->au = ppVar19->au - wVar12;
      inven_carry(ppVar19,obj,true,false);
      kind->everseen = true;
    }
LAB_00198432:
    ppsVar24 = &psVar5->next;
  } while( true );
}

Assistant:

void do_cmd_accept_character(struct command *cmd)
{
	options_init_cheat();

	roll_hp();

	ignore_birth_init();

	/* Clear old messages, add new starting message */
	history_clear(player);
	history_add(player, "Began the quest to destroy Morgoth.", HIST_PLAYER_BIRTH);

	/* Note player birth in the message recall */
	message_add(" ", MSG_GENERIC);
	message_add("  ", MSG_GENERIC);
	message_add("====================", MSG_GENERIC);
	message_add("  ", MSG_GENERIC);
	message_add(" ", MSG_GENERIC);

	/* Embody */
	player_embody(player);

	/* Give the player some money */
	get_money(player);

	/* Initialise the spells */
	player_spells_init(player);

	/* Know all runes for ID on walkover */
	if (OPT(player, birth_know_runes))
		player_learn_all_runes(player);

	/* Hack - player knows all combat runes.  Maybe make them not runes? NRM */
	player->obj_k->to_a = 1;
	player->obj_k->to_h = 1;
	player->obj_k->to_d = 1;

	/* Initialise the stores, dungeon */
	store_reset();
	chunk_list_max = 0;

	/* Player learns innate runes */
	player_learn_innate(player);

	/* Restore the standard artifacts (randarts may have been loaded) */
	cleanup_parser(&randart_parser);
	deactivate_randart_file();
	run_parser(&artifact_parser);

	/* Now only randomize the artifacts if required */
	if (OPT(player, birth_randarts)) {
		seed_randart = randint0(0x10000000);
		do_randart(seed_randart, true);
		deactivate_randart_file();
	}

	/* Seed for flavors */
	seed_flavor = randint0(0x10000000);
	flavor_init();

	/* Know all flavors for auto-ID of consumables */
	if (OPT(player, birth_know_flavors))
		flavor_set_all_aware();

	/* Outfit the player, if they can sell the stuff */
	player_outfit(player);

	/* Stop the player being quite so dead */
	player->is_dead = false;

	/* Character is now "complete" */
	character_generated = true;
	player->upkeep->playing = true;

	/* Disable repeat command, so we don't try to be born again */
	cmd_disable_repeat();

	/* No longer need the cached history. */
	string_free(prev.history);
	prev.history = NULL;
	string_free(quickstart_prev.history);
	quickstart_prev.history = NULL;

	/* Now we're really done.. */
	event_signal(EVENT_LEAVE_BIRTH);
}